

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O2

size_t GetUTF8Step(char firstbyte)

{
  size_t sVar1;
  undefined8 uStack_8;
  
  if (firstbyte < '\0') {
    if ((firstbyte & 0xe0U) == 0xc0) {
      uStack_8 = 2;
    }
    else if ((firstbyte & 0xf0U) == 0xe0) {
      uStack_8 = 3;
    }
    else if ((firstbyte & 0xf8U) == 0xf0) {
      uStack_8 = 4;
    }
    else {
      if ((firstbyte & 0xfcU) != 0xf8) {
        sVar1 = 6;
        if ((firstbyte & 0xfeU) != 0xfc) {
          sVar1 = 0;
        }
        return sVar1;
      }
      uStack_8 = 5;
    }
  }
  else {
    uStack_8 = 1;
  }
  return uStack_8;
}

Assistant:

size_t GetUTF8Step(char firstbyte)
{
	if ((firstbyte & 0x80) == 0x00)
	{
		return 1;
	}
	else if ((firstbyte & 0xe0) == 0xc0)
	{
		return 2;
	}
	else if ((firstbyte & 0xf0) == 0xe0)
	{
		return 3;
	}
	else if ((firstbyte & 0xf8) == 0xf0)
	{
		return 4;
	}
	else if ((firstbyte & 0xfc) == 0xf8)
	{
		return 5;
	}
	else if ((firstbyte & 0xfe) == 0xfc)
	{
		return 6;
	}
	return 0;
}